

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_property(nk_context *ctx,char *name,nk_property_variant *variant,float inc_per_pixel,
                nk_property_filter filter)

{
  ulong uVar1;
  nk_style_item_data *img;
  nk_flags *state;
  nk_command_buffer *b;
  nk_vec2 nVar2;
  nk_property nVar3;
  byte bVar4;
  uchar uVar5;
  nk_hash seed;
  nk_property_kind nVar6;
  nk_panel *pnVar7;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var8;
  nk_plugin_filter filter_00;
  double dVar9;
  double dVar10;
  nk_plugin_paste p_Var11;
  undefined8 uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  int *piVar15;
  int *piVar16;
  int *piVar17;
  nk_button_behavior behavior;
  nk_widget_layout_states nVar18;
  uint uVar19;
  int iVar20;
  nk_bool nVar21;
  int iVar22;
  nk_style_property *pnVar23;
  nk_context *in;
  char *pcVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  nk_context *pnVar28;
  long lVar29;
  byte *pbVar30;
  byte *pbVar31;
  nk_window *pnVar32;
  nk_handle *pnVar33;
  int *piVar34;
  nk_color c;
  bool bVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined4 uVar40;
  float fVar41;
  undefined4 uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect b_00;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect bounds_02;
  int num_len;
  int dummy_select_end;
  int dummy_select_begin;
  int dummy_cursor;
  int dummy_length;
  int dummy_state;
  nk_rect bounds;
  char dummy_buffer [64];
  int *local_270;
  char *local_258;
  int local_248;
  int local_244;
  int *local_240;
  nk_window *local_238;
  nk_handle *local_230;
  undefined8 local_228;
  float fStack_220;
  float fStack_21c;
  nk_context *local_210;
  nk_rect local_208;
  undefined1 local_1f8 [16];
  char *local_1e8;
  int *local_1e0;
  int *local_1d8;
  int *local_1d0;
  nk_hash local_1c4;
  int local_1c0;
  float local_1bc;
  nk_button_behavior local_1b8;
  int local_1b4 [5];
  int *local_1a0;
  undefined1 local_198 [12];
  undefined4 uStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  undefined4 uStack_124;
  float fStack_120;
  float fStack_11c;
  nk_text local_118;
  byte local_108 [64];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  nk_rect local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  char local_78 [72];
  
  local_1b4[4] = 0;
  local_1b4[3] = 0;
  local_1b4[2] = 0;
  local_1b4[1] = 0;
  local_1b4[0] = 0;
  pnVar32 = ctx->current;
  if (pnVar32 == (nk_window *)0x0) {
    return;
  }
  pnVar7 = pnVar32->layout;
  if (pnVar7 == (nk_panel *)0x0) {
    return;
  }
  nVar18 = nk_widget(&local_a8,ctx);
  if (nVar18 == NK_WIDGET_INVALID) {
    return;
  }
  bVar4 = *name;
  uVar25 = (ulong)bVar4;
  if (bVar4 == 0) {
LAB_001251ba:
    local_1c4 = nk_murmur_hash(name,(int)uVar25,0x2a);
  }
  else {
    if (bVar4 != 0x23) {
      uVar25 = 0;
      do {
        lVar29 = uVar25 + 1;
        uVar25 = uVar25 + 1;
      } while (name[lVar29] != '\0');
      goto LAB_001251ba;
    }
    lVar29 = 0;
    do {
      lVar27 = lVar29 + 1;
      lVar29 = lVar29 + 1;
    } while (name[lVar27] != '\0');
    seed = (pnVar32->property).seq;
    (pnVar32->property).seq = seed + 1;
    local_1c4 = nk_murmur_hash(name,(int)lVar29,seed);
    name = name + 1;
  }
  local_1d0 = local_1b4;
  local_1d8 = local_1b4 + 1;
  local_1e0 = local_1b4 + 2;
  local_240 = local_1b4 + 3;
  local_258 = local_78;
  local_270 = local_1b4 + 4;
  local_248 = 0;
  if (((pnVar32->property).active != 0) && (local_1c4 == (pnVar32->property).name)) {
    local_258 = (pnVar32->property).buffer;
    local_240 = &(pnVar32->property).length;
    local_1e0 = &(pnVar32->property).cursor;
    local_270 = &(pnVar32->property).state;
    local_1d8 = &(pnVar32->property).select_start;
    local_1d0 = &(pnVar32->property).select_end;
    local_248 = (pnVar32->property).state;
  }
  (ctx->text_edit).clip.copy = (ctx->clip).copy;
  p_Var11 = (ctx->clip).paste;
  (ctx->text_edit).clip.userdata = (ctx->clip).userdata;
  (ctx->text_edit).clip.paste = p_Var11;
  if ((nVar18 == NK_WIDGET_ROM) && ((pnVar32->property).active == 0)) {
    pnVar28 = (nk_context *)0x0;
  }
  else {
    pnVar28 = (nk_context *)0x0;
    if ((pnVar7->flags & 0x1000) == 0) {
      pnVar28 = ctx;
    }
  }
  pnVar33 = &((ctx->style).font)->userdata;
  local_178 = local_a8.y;
  fStack_220 = local_a8.h;
  local_168 = local_a8.w;
  fStack_164 = local_a8.h;
  uStack_160 = 0;
  local_1f8 = ZEXT416((uint)(*(float *)(pnVar33 + 1) * 0.5));
  local_1bc = (ctx->style).property.border;
  local_208.x = local_a8.x;
  local_208.y = local_a8.y;
  local_208.w = 0.0;
  local_208.h = 0.0;
  local_148._0_4_ = local_a8.x + local_1bc + (ctx->style).property.padding.x;
  uStack_140 = 0;
  local_228 = (nk_command_buffer *)CONCAT44(fStack_220,fStack_220);
  if (*name == '\0') {
    lVar29 = 0;
  }
  else {
    lVar29 = 0;
    do {
      lVar27 = lVar29 + 1;
      lVar29 = lVar29 + 1;
    } while (name[lVar27] != '\0');
  }
  local_1b8 = ctx->button_behavior;
  local_238 = pnVar32;
  local_230 = pnVar33;
  fStack_21c = fStack_220;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  local_148._4_4_ = local_178;
  fVar36 = (*(code *)pnVar33[2])(*pnVar33,*(float *)(pnVar33 + 1),name,(int)lVar29);
  pnVar32 = local_238;
  piVar34 = local_240;
  fVar37 = (ctx->style).property.border;
  nVar2 = (ctx->style).property.padding;
  fVar41 = nVar2.x;
  fVar44 = nVar2.y;
  local_188 = (float)local_148 + (float)local_1f8._0_4_ + fVar41;
  fStack_184 = fVar37 + local_208.y + fVar44;
  fStack_180 = local_148._4_4_ + local_208.w + 0.0;
  fStack_17c = local_208.h + 0.0 + 0.0;
  local_158 = CONCAT44(fVar44,fVar41 + fVar41 + fVar36);
  uStack_150 = 0;
  local_138 = (local_208.x + local_168) - ((float)local_1f8._0_4_ + fVar41);
  fStack_134 = local_208.y;
  fStack_130 = local_208.w;
  fStack_12c = local_208.h;
  local_c8 = local_208.x + local_168;
  fStack_c4 = local_208.y;
  fStack_c0 = local_208.w;
  fStack_bc = local_208.h;
  _local_198 = ZEXT416((uint)(fVar37 + fVar37 + fVar44 + fVar44));
  local_210 = pnVar28;
  if (*local_270 != 1) {
    if (variant->kind == NK_PROPERTY_DOUBLE) {
      nk_dtoa((char *)local_108,(variant->value).d);
      lVar27 = 0;
      iVar20 = 0;
      do {
        iVar22 = 1;
        if (local_108[lVar27] != 0x2e) {
          pnVar32 = local_238;
          if (local_108[lVar27] == 0) goto LAB_0012564b;
          if (iVar20 == 3) goto LAB_0012555e;
          iVar22 = (uint)(0 < iVar20) + iVar20;
        }
        iVar20 = iVar22;
        lVar27 = lVar27 + 1;
      } while( true );
    }
    if (variant->kind == NK_PROPERTY_FLOAT) {
      nk_dtoa((char *)local_108,(double)(variant->value).f);
      lVar27 = 0;
      iVar20 = 0;
      do {
        iVar22 = 1;
        if (local_108[lVar27] != 0x2e) {
          if (local_108[lVar27] == 0) goto LAB_0012564b;
          if (iVar20 == 3) goto LAB_0012555e;
          iVar22 = (uint)(0 < iVar20) + iVar20;
        }
        iVar20 = iVar22;
        lVar27 = lVar27 + 1;
      } while( true );
    }
    iVar20 = (variant->value).i;
    uVar25 = (ulong)iVar20;
    if (uVar25 == 0) {
      local_108[0] = 0x30;
      local_108[1] = 0;
    }
    else {
      if (iVar20 < 0) {
        local_108[0] = 0x2d;
        uVar25 = -uVar25;
      }
      pbVar30 = local_108 + (iVar20 < 0);
      do {
        *pbVar30 = (char)uVar25 + (char)(uVar25 / 10) * -10 | 0x30;
        pbVar30 = pbVar30 + 1;
        bVar35 = 9 < uVar25;
        uVar25 = uVar25 / 10;
      } while (bVar35);
      *pbVar30 = 0;
      uVar25 = (ulong)(local_108[0] == 0x2d);
      if (local_108[uVar25] != 0) {
        pbVar30 = local_108 + uVar25;
        uVar1 = 0;
        do {
          uVar26 = uVar1;
          uVar1 = uVar26 + 1;
        } while (local_108[uVar26 + uVar25 + 1] != 0);
        if ((int)uVar1 != 1) {
          lVar27 = 0;
          pbVar31 = pbVar30;
          do {
            bVar4 = *pbVar31;
            *pbVar31 = pbVar30[uVar26 + lVar27];
            pbVar30[uVar26 + lVar27] = bVar4;
            lVar27 = lVar27 + -1;
            pbVar31 = pbVar31 + 1;
          } while (-lVar27 != uVar1 >> 1);
        }
      }
      if (local_108[0] == 0) {
        lVar27 = 0;
        goto LAB_0012564b;
      }
    }
    lVar27 = 0;
    do {
      lVar13 = lVar27 + 1;
      lVar27 = lVar27 + 1;
    } while (local_108[lVar13] != 0);
    goto LAB_0012564b;
  }
  fVar37 = (*(code *)pnVar33[2])(*pnVar33,(float)pnVar33[1].id,local_258,*local_240);
  fVar37 = fVar37 + (ctx->style).property.edit.cursor_size;
  local_1e8 = local_258;
  local_1a0 = piVar34;
  pnVar28 = local_210;
  pnVar32 = local_238;
LAB_0012567c:
  fVar44 = (float)local_228 - (float)local_198._0_4_;
  state = &ctx->last_widget_state;
  fVar36 = (ctx->style).property.border;
  fVar41 = (ctx->style).property.padding.x;
  local_198._0_4_ = fVar41 + fVar41 + fVar37;
  fVar37 = local_138 - (local_188 + (float)local_158);
  if (fVar37 <= (float)local_198._0_4_) {
    local_198._0_4_ = fVar37;
  }
  local_b8 = local_138 - (fVar41 + (float)local_198._0_4_);
  fStack_b4 = local_178 + fVar36;
  fStack_b0 = fStack_134;
  fStack_ac = fStack_174;
  local_198._4_4_ = (float)local_228 - (fVar36 + fVar36);
  local_198._8_4_ = 0;
  uStack_18c = local_228._4_4_;
  local_1c0 = *local_270;
  fVar37 = local_178;
  fVar36 = fStack_174;
  fVar41 = fStack_170;
  fVar43 = fStack_16c;
  uVar40 = local_228._4_4_;
  fVar45 = fStack_220;
  fVar46 = fStack_21c;
  if (pnVar28 == (nk_context *)0x0) {
    if (local_1c0 == 2) {
      uVar19 = *state & 2 | 4;
LAB_00125a38:
      *state = uVar19;
      goto LAB_00125a3b;
    }
  }
  else {
    if (local_1c0 == 0) {
      fStack_94 = fStack_134;
      fStack_90 = fStack_130;
      fStack_8c = fStack_12c;
      fStack_84 = fStack_184;
      fStack_80 = fStack_180;
      fStack_7c = fStack_17c;
      r.y = fStack_b4;
      r.x = local_b8;
      uStack_124 = local_228._4_4_;
      fStack_120 = fStack_220;
      fStack_11c = fStack_21c;
      r.w = (float)local_198._0_4_;
      r.h = (float)local_198._4_4_;
      local_128 = fVar44;
      local_98 = local_b8;
      local_88 = local_188 + (float)local_158;
      nVar21 = nk_button_behavior(state,r,&pnVar28->input,NK_BUTTON_DEFAULT);
      fVar46 = fStack_11c;
      fVar45 = fStack_120;
      uVar40 = uStack_124;
      fVar44 = local_128;
      fVar43 = fStack_16c;
      fVar41 = fStack_170;
      fVar36 = fStack_174;
      fVar37 = local_178;
      iVar20 = 1;
      if (nVar21 == 0) {
        fVar38 = (pnVar28->input).mouse.buttons[0].clicked_pos.x;
        if (((((local_188 <= fVar38) && (fVar38 < local_88)) &&
             (fVar39 = (pnVar28->input).mouse.buttons[0].clicked_pos.y, fStack_184 <= fVar39)) &&
            (((fVar39 < fStack_184 + local_128 && ((pnVar28->input).mouse.buttons[0].down == 1)) &&
             ((pnVar28->input).mouse.buttons[0].clicked != 0)))) ||
           (((local_88 <= fVar38 && (fVar38 < (local_98 - local_88) + local_88)) &&
            ((fVar39 = (pnVar28->input).mouse.buttons[0].clicked_pos.y, local_178 <= fVar39 &&
             (((fVar39 < local_178 + (float)local_228 &&
               ((pnVar28->input).mouse.buttons[0].down == 1)) &&
              ((pnVar28->input).mouse.buttons[0].clicked != 0)))))))) {
          *local_270 = 2;
        }
        else if (*local_270 != 2) goto LAB_00125a48;
        goto LAB_0012573c;
      }
    }
    else {
      if (local_1c0 != 2) goto LAB_00125a48;
      fVar38 = (pnVar28->input).mouse.buttons[0].clicked_pos.x;
LAB_0012573c:
      iVar20 = (pnVar28->input).mouse.buttons[0].down;
      bVar35 = false;
      if ((local_208.x <= fVar38) && (bVar35 = false, fVar38 < local_c8)) {
        fVar38 = (pnVar28->input).mouse.buttons[0].clicked_pos.y;
        bVar35 = iVar20 == 1 && (fVar38 < fVar37 + (float)local_228 && fVar37 <= fVar38);
      }
      uVar19 = *state & 2 | 4;
      *state = uVar19;
      fVar38 = (pnVar28->input).mouse.pos.x;
      if (((local_208.x <= fVar38) && (fVar38 < local_c8)) &&
         ((fVar38 = (pnVar28->input).mouse.pos.y, fVar37 <= fVar38 &&
          (fVar38 < fVar37 + (float)local_228)))) {
        *state = 0x12;
        uVar19 = 0x12;
      }
      if (bVar35 && iVar20 != 0) {
        fVar38 = inc_per_pixel * (pnVar28->input).mouse.delta.x;
        nVar6 = variant->kind;
        if (nVar6 == NK_PROPERTY_DOUBLE) {
          dVar9 = (double)fVar38 + (variant->value).d;
          if ((variant->max_value).d <= dVar9) {
            dVar9 = (variant->max_value).d;
          }
          dVar10 = (variant->min_value).d;
          if ((variant->min_value).d <= dVar9) {
            dVar10 = dVar9;
          }
          (variant->value).d = dVar10;
        }
        else if (nVar6 == NK_PROPERTY_FLOAT) {
          fVar38 = fVar38 + (variant->value).f;
          if ((variant->max_value).f <= fVar38) {
            fVar38 = (variant->max_value).f;
          }
          fVar39 = (variant->min_value).f;
          if ((variant->min_value).f <= fVar38) {
            fVar39 = fVar38;
          }
          (variant->value).f = fVar39;
        }
        else if (nVar6 == NK_PROPERTY_INT) {
          iVar20 = (int)fVar38 + (variant->value).i;
          if ((variant->max_value).i <= iVar20) {
            iVar20 = (variant->max_value).i;
          }
          if (iVar20 <= (variant->min_value).i) {
            iVar20 = (variant->min_value).i;
          }
          (variant->value).i = iVar20;
        }
        *state = 0x22;
        uVar19 = 0x22;
LAB_00125a05:
        fVar38 = (pnVar28->input).mouse.prev.x;
      }
      else {
        if ((uVar19 & 0x10) == 0) goto LAB_00125a05;
        fVar38 = (pnVar28->input).mouse.prev.x;
        if ((((fVar38 < local_208.x) || (local_c8 <= fVar38)) ||
            (fVar39 = (pnVar28->input).mouse.prev.y, fVar39 < fVar37)) ||
           (fVar37 + (float)local_228 <= fVar39)) {
          uVar19 = uVar19 | 8;
          goto LAB_00125a38;
        }
      }
      if (((local_208.x <= fVar38) && (fVar38 < local_c8)) &&
         ((fVar38 = (pnVar28->input).mouse.prev.y, fVar37 <= fVar38 &&
          (fVar38 < fVar37 + (float)local_228)))) {
        uVar19 = uVar19 | 0x40;
        goto LAB_00125a38;
      }
LAB_00125a3b:
      iVar20 = 0;
      if ((uVar19 & 0x20) != 0) goto LAB_00125a48;
    }
    *local_270 = iVar20;
  }
LAB_00125a48:
  local_228._0_4_ = (float)local_228 * 0.5;
  b = &pnVar32->buffer;
  p_Var8 = (ctx->style).property.draw_begin;
  fVar38 = fVar37 + local_1bc;
  if (p_Var8 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    local_178 = fVar37 + local_1bc;
    fStack_174 = fVar36;
    fStack_170 = fVar41;
    fStack_16c = fVar43;
    local_128 = fVar44;
    uStack_124 = uVar40;
    fStack_120 = fVar45;
    fStack_11c = fVar46;
    (*p_Var8)(b,(ctx->style).property.userdata);
    fVar38 = local_178;
    fVar44 = local_128;
    uVar40 = uStack_124;
  }
  pnVar33 = local_230;
  if ((*state & 0x20) == 0) {
    if ((*state & 0x10) == 0) {
      pnVar23 = &(ctx->style).property;
      local_118.text = (ctx->style).property.label_normal;
    }
    else {
      pnVar23 = (nk_style_property *)&(ctx->style).property.hover;
      local_118.text = (ctx->style).property.label_hover;
    }
  }
  else {
    pnVar23 = (nk_style_property *)&(ctx->style).property.active;
    local_118.text = (ctx->style).property.label_active;
  }
  local_228 = (nk_command_buffer *)
              CONCAT44(local_228._4_4_,((float)local_228 + fVar38) - (float)local_1f8._0_4_ * 0.5);
  uVar12 = CONCAT44(fVar44,(int)local_158);
  uStack_150 = CONCAT44(uVar40,local_158._4_4_);
  img = &(pnVar23->normal).data;
  local_158 = uVar12;
  if ((pnVar23->normal).type == NK_STYLE_ITEM_IMAGE) {
    r_00.w = local_168;
    r_00.h = fStack_164;
    r_00.x = local_208.x;
    r_00.y = local_208.y;
    nk_draw_image(b,r_00,&img->image,(nk_color)0xffffffff);
    c.r = '\0';
    c.g = '\0';
    c.b = '\0';
    c.a = '\0';
  }
  else {
    c = img->color;
    rect.w = local_168;
    rect.h = fStack_164;
    rect.x = local_208.x;
    rect.y = local_208.y;
    nk_fill_rect(b,rect,(ctx->style).property.rounding,c);
    pnVar33 = local_230;
    rect_00.w = local_168;
    rect_00.h = fStack_164;
    rect_00.x = local_208.x;
    rect_00.y = local_208.y;
    nk_stroke_rect(b,rect_00,(ctx->style).property.rounding,(ctx->style).property.border,img->color)
    ;
  }
  fVar37 = local_148._4_4_;
  local_1f8._4_4_ = local_1f8._0_4_;
  local_1f8._8_4_ = local_1f8._0_4_;
  local_1f8._12_4_ = local_1f8._0_4_;
  local_148 = CONCAT44((float)local_228,(float)local_148);
  uStack_140 = CONCAT44(local_228._4_4_,fVar37);
  local_118.padding.x = 0.0;
  local_118.padding.y = 0.0;
  b_00.y = fStack_184;
  b_00.x = local_188;
  b_00.w = (float)local_158;
  b_00.h = (float)local_158._4_4_;
  local_118.background = c;
  nk_widget_text(b,b_00,name,(int)lVar29,&local_118,0x12,(nk_user_font *)pnVar33);
  behavior = local_1b8;
  pnVar28 = local_210;
  p_Var8 = (ctx->style).property.draw_end;
  if (p_Var8 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var8)(b,(ctx->style).property.userdata);
  }
  fStack_130 = fStack_134;
  auVar14 = local_1f8;
  fStack_134 = (float)local_228;
  fStack_12c = (float)local_228._4_4_;
  bounds_00.w = (float)local_1f8._0_4_;
  bounds_00.h = (float)local_1f8._4_4_;
  bounds_00.x = (float)local_148;
  bounds_00.y = local_148._4_4_;
  local_228 = b;
  local_1f8 = auVar14;
  nVar21 = nk_do_button_symbol(state,b,bounds_00,(ctx->style).property.sym_left,behavior,
                               &(ctx->style).property.dec_button,&pnVar28->input,
                               (nk_user_font *)pnVar33);
  piVar34 = local_1a0;
  auVar14 = local_1f8;
  if (nVar21 != 0) {
    nVar6 = variant->kind;
    if (nVar6 == NK_PROPERTY_DOUBLE) {
      dVar9 = (variant->value).d - (variant->step).d;
      if ((variant->max_value).d <= dVar9) {
        dVar9 = (variant->max_value).d;
      }
      dVar10 = (variant->min_value).d;
      if ((variant->min_value).d <= dVar9) {
        dVar10 = dVar9;
      }
      (variant->value).d = dVar10;
    }
    else if (nVar6 == NK_PROPERTY_FLOAT) {
      fVar37 = (variant->value).f - (variant->step).f;
      if ((variant->max_value).f <= fVar37) {
        fVar37 = (variant->max_value).f;
      }
      fVar36 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar37) {
        fVar36 = fVar37;
      }
      (variant->value).f = fVar36;
    }
    else if (nVar6 == NK_PROPERTY_INT) {
      iVar20 = (variant->value).i - (variant->step).i;
      if ((variant->max_value).i <= iVar20) {
        iVar20 = (variant->max_value).i;
      }
      if (iVar20 <= (variant->min_value).i) {
        iVar20 = (variant->min_value).i;
      }
      (variant->value).i = iVar20;
    }
  }
  bounds_01.y = fStack_134;
  bounds_01.x = local_138;
  bounds_01.w = (float)local_1f8._0_4_;
  bounds_01.h = (float)local_1f8._4_4_;
  local_1f8 = auVar14;
  nVar21 = nk_do_button_symbol(state,local_228,bounds_01,(ctx->style).property.sym_right,behavior,
                               &(ctx->style).property.inc_button,&pnVar28->input,
                               (nk_user_font *)pnVar33);
  if (nVar21 != 0) {
    nVar6 = variant->kind;
    if (nVar6 == NK_PROPERTY_DOUBLE) {
      dVar9 = (variant->value).d + (variant->step).d;
      if ((variant->max_value).d <= dVar9) {
        dVar9 = (variant->max_value).d;
      }
      dVar10 = (variant->min_value).d;
      if ((variant->min_value).d <= dVar9) {
        dVar10 = dVar9;
      }
      (variant->value).d = dVar10;
    }
    else if (nVar6 == NK_PROPERTY_FLOAT) {
      fVar37 = (variant->value).f + (variant->step).f;
      if ((variant->max_value).f <= fVar37) {
        fVar37 = (variant->max_value).f;
      }
      fVar36 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar37) {
        fVar36 = fVar37;
      }
      (variant->value).f = fVar36;
    }
    else if (nVar6 == NK_PROPERTY_INT) {
      iVar20 = (variant->step).i + (variant->value).i;
      if ((variant->max_value).i <= iVar20) {
        iVar20 = (variant->max_value).i;
      }
      if (iVar20 <= (variant->min_value).i) {
        iVar20 = (variant->min_value).i;
      }
      (variant->value).i = iVar20;
    }
  }
  bVar35 = local_1c0 == 1;
  iVar20 = *local_270;
  pcVar24 = local_1e8;
  if (iVar20 == 1 && !bVar35) {
    nk_memcopy(local_258,local_1e8,(long)*piVar34);
    iVar22 = nk_utf_len(local_258,*piVar34);
    *local_1e0 = iVar22;
    *local_240 = *piVar34;
    pcVar24 = local_258;
    piVar34 = local_240;
  }
  auVar14 = _local_198;
  piVar17 = local_1d0;
  piVar16 = local_1d8;
  piVar15 = local_1e0;
  pnVar28 = local_210;
  bVar35 = (iVar20 != 1 || bVar35) && iVar20 == 1;
  local_1f8[0] = local_210 == (nk_context *)0x0;
  filter_00 = (nk_plugin_filter)(&PTR_nk_filter_decimal_00197490)[filter];
  (ctx->text_edit).undo.undo_point = 0;
  (ctx->text_edit).undo.redo_point = 99;
  (ctx->text_edit).undo.undo_char_point = 0;
  (ctx->text_edit).undo.redo_char_point = 999;
  (ctx->text_edit).select_end = 0;
  (ctx->text_edit).preferred_x = 0.0;
  (ctx->text_edit).cursor_at_end_of_line = '\0';
  (ctx->text_edit).initialized = '\x01';
  (ctx->text_edit).has_preferred_x = '\0';
  (ctx->text_edit).single_line = '\x01';
  (ctx->text_edit).filter = filter_00;
  (ctx->text_edit).scrollbar.x = 0.0;
  (ctx->text_edit).scrollbar.y = 0.0;
  (ctx->text_edit).cursor = 0;
  (ctx->text_edit).select_start = 0;
  (ctx->text_edit).active = bVar35;
  iVar20 = *piVar34;
  (ctx->text_edit).string.len = iVar20;
  if (*local_1e0 < iVar20) {
    iVar20 = *local_1e0;
  }
  if (iVar20 < 1) {
    iVar20 = 0;
  }
  (ctx->text_edit).cursor = iVar20;
  iVar20 = *piVar34;
  if (*local_1d8 < *piVar34) {
    iVar20 = *local_1d8;
  }
  if (iVar20 < 1) {
    iVar20 = 0;
  }
  (ctx->text_edit).select_start = iVar20;
  iVar20 = *piVar34;
  if (*local_1d0 < *piVar34) {
    iVar20 = *local_1d0;
  }
  if (iVar20 < 1) {
    iVar20 = 0;
  }
  (ctx->text_edit).select_end = iVar20;
  (ctx->text_edit).string.buffer.allocated = (long)*piVar34;
  (ctx->text_edit).string.buffer.memory.size = 0x40;
  (ctx->text_edit).string.buffer.memory.ptr = pcVar24;
  (ctx->text_edit).string.buffer.size = 0x40;
  (ctx->text_edit).mode = '\x01';
  in = (nk_context *)0x0;
  if (*local_270 == 1) {
    in = local_210;
  }
  bounds_02.y = fStack_b4;
  bounds_02.x = local_b8;
  bounds_02.w = (float)local_198._0_4_;
  bounds_02.h = (float)local_198._4_4_;
  _local_198 = auVar14;
  nk_do_edit(state,local_228,bounds_02,0x262,filter_00,&ctx->text_edit,&(ctx->style).property.edit,
             &in->input,(nk_user_font *)local_230);
  pnVar32 = local_238;
  *piVar34 = (ctx->text_edit).string.len;
  *piVar15 = (ctx->text_edit).cursor;
  *piVar16 = (ctx->text_edit).select_start;
  *piVar17 = (ctx->text_edit).select_end;
  uVar5 = (ctx->text_edit).active;
  if (uVar5 == '\0' || local_1f8[0] != '\0') {
    if (bVar35 && uVar5 == '\0') {
LAB_00126009:
      *local_270 = 0;
      local_258[*local_240] = 0;
      nVar6 = variant->kind;
      if (nVar6 == NK_PROPERTY_INT) {
        iVar22 = nk_strtoi(local_258,(char **)0x0);
        iVar20 = (variant->max_value).i;
        if (iVar22 < (variant->max_value).i) {
          iVar20 = iVar22;
        }
        if (iVar20 <= (variant->min_value).i) {
          iVar20 = (variant->min_value).i;
        }
        (variant->value).i = iVar20;
      }
      else {
        if (nVar6 == NK_PROPERTY_FLOAT) {
          iVar20 = 0;
          pcVar24 = local_258;
          do {
            iVar22 = 1;
            if (*pcVar24 != 0x2e) {
              if (*pcVar24 == 0) goto LAB_001260c3;
              if (iVar20 == 3) goto LAB_001260c0;
              iVar22 = (uint)(0 < iVar20) + iVar20;
            }
            iVar20 = iVar22;
            pcVar24 = pcVar24 + 1;
          } while( true );
        }
        if (nVar6 == NK_PROPERTY_DOUBLE) {
          iVar20 = 0;
          pcVar24 = local_258;
          do {
            iVar22 = 1;
            if (*pcVar24 != 0x2e) {
              if (*pcVar24 == 0) goto LAB_001260ee;
              if (iVar20 == 3) goto LAB_001260eb;
              iVar22 = (uint)(0 < iVar20) + iVar20;
            }
            iVar20 = iVar22;
            pcVar24 = pcVar24 + 1;
          } while( true );
        }
      }
    }
    goto LAB_00126110;
  }
  uVar19 = (pnVar28->input).keyboard.keys[4].clicked;
  if ((pnVar28->input).keyboard.keys[4].down == 0) {
    if (1 < uVar19) goto LAB_00125ffa;
  }
  else if (uVar19 != 0) {
LAB_00125ffa:
    (ctx->text_edit).active = '\0';
    if (bVar35) goto LAB_00126009;
  }
  goto LAB_0012611c;
LAB_0012555e:
  local_108[lVar27] = 0;
LAB_0012564b:
  local_244 = (int)lVar27;
  local_1e8 = (char *)local_108;
  fVar37 = (*(code *)local_230[2])(*local_230,(float)local_230[1].id,local_1e8,local_244);
  local_1a0 = &local_244;
  goto LAB_0012567c;
LAB_001260c0:
  *pcVar24 = 0;
LAB_001260c3:
  dVar9 = nk_strtod(local_258,(char **)0x0);
  fVar37 = (float)dVar9;
  if ((variant->max_value).f <= (float)dVar9) {
    fVar37 = (variant->max_value).f;
  }
  fVar36 = (variant->min_value).f;
  if ((variant->min_value).f <= fVar37) {
    fVar36 = fVar37;
  }
  (variant->value).f = fVar36;
  goto LAB_00126110;
LAB_001260eb:
  *pcVar24 = 0;
LAB_001260ee:
  dVar9 = nk_strtod(local_258,(char **)0x0);
  iVar20 = SUB84(dVar9,0);
  uVar40 = (undefined4)((ulong)dVar9 >> 0x20);
  nVar3 = variant->max_value;
  if (nVar3.d <= dVar9) {
    iVar20 = nVar3.i;
    uVar40 = nVar3._4_4_;
  }
  nVar3 = variant->min_value;
  iVar22 = nVar3.i;
  uVar42 = nVar3._4_4_;
  if (nVar3.d <= (double)CONCAT44(uVar40,iVar20)) {
    iVar22 = iVar20;
    uVar42 = uVar40;
  }
  nVar3._4_4_ = uVar42;
  nVar3.i = iVar22;
  variant->value = nVar3;
LAB_00126110:
  if (local_210 == (nk_context *)0x0) {
    iVar20 = *local_270;
  }
  else {
LAB_0012611c:
    piVar34 = local_240;
    if (*local_270 == 0) {
      iVar20 = 0;
    }
    else {
      if ((pnVar32->property).active != 0) {
        return;
      }
      (pnVar32->property).active = 1;
      nk_memcopy((pnVar32->property).buffer,local_258,(long)*local_240);
      (pnVar32->property).length = *piVar34;
      (pnVar32->property).cursor = *local_1e0;
      iVar20 = *local_270;
      (pnVar32->property).state = iVar20;
      (pnVar32->property).name = local_1c4;
      (pnVar32->property).select_start = *local_1d8;
      (pnVar32->property).select_end = *local_1d0;
      if (iVar20 == 2) {
        (ctx->input).mouse.grab = '\x01';
        (ctx->input).mouse.grabbed = '\x01';
        return;
      }
    }
  }
  if (local_248 != 0 && iVar20 == 0) {
    if (local_248 == 2) {
      (ctx->input).mouse.grab = '\0';
      (ctx->input).mouse.grabbed = '\0';
      (ctx->input).mouse.ungrab = '\x01';
    }
    (pnVar32->property).select_start = 0;
    (pnVar32->property).select_end = 0;
    (pnVar32->property).active = 0;
  }
  return;
}

Assistant:

NK_LIB void
nk_property(struct nk_context *ctx, const char *name, struct nk_property_variant *variant,
float inc_per_pixel, const enum nk_property_filter filter)
{
struct nk_window *win;
struct nk_panel *layout;
struct nk_input *in;
const struct nk_style *style;

struct nk_rect bounds;
enum nk_widget_layout_states s;

int *state = 0;
nk_hash hash = 0;
char *buffer = 0;
int *len = 0;
int *cursor = 0;
int *select_begin = 0;
int *select_end = 0;
int old_state;

char dummy_buffer[NK_MAX_NUMBER_BUFFER];
int dummy_state = NK_PROPERTY_DEFAULT;
int dummy_length = 0;
int dummy_cursor = 0;
int dummy_select_begin = 0;
int dummy_select_end = 0;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
style = &ctx->style;
s = nk_widget(&bounds, ctx);
if (!s) return;

/* calculate hash from name */
if (name[0] == '#') {
hash = nk_murmur_hash(name, (int)nk_strlen(name), win->property.seq++);
name++; /* special number hash */
} else hash = nk_murmur_hash(name, (int)nk_strlen(name), 42);

/* check if property is currently hot item */
if (win->property.active && hash == win->property.name) {
buffer = win->property.buffer;
len = &win->property.length;
cursor = &win->property.cursor;
state = &win->property.state;
select_begin = &win->property.select_start;
select_end = &win->property.select_end;
} else {
buffer = dummy_buffer;
len = &dummy_length;
cursor = &dummy_cursor;
state = &dummy_state;
select_begin =  &dummy_select_begin;
select_end = &dummy_select_end;
}

/* execute property widget */
old_state = *state;
ctx->text_edit.clip = ctx->clip;
in = ((s == NK_WIDGET_ROM && !win->property.active) ||
layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
nk_do_property(&ctx->last_widget_state, &win->buffer, bounds, name,
variant, inc_per_pixel, buffer, len, state, cursor, select_begin,
select_end, &style->property, filter, in, style->font, &ctx->text_edit,
ctx->button_behavior);

if (in && *state != NK_PROPERTY_DEFAULT && !win->property.active) {
/* current property is now hot */
win->property.active = 1;
NK_MEMCPY(win->property.buffer, buffer, (nk_size)*len);
win->property.length = *len;
win->property.cursor = *cursor;
win->property.state = *state;
win->property.name = hash;
win->property.select_start = *select_begin;
win->property.select_end = *select_end;
if (*state == NK_PROPERTY_DRAG) {
ctx->input.mouse.grab = nk_true;
ctx->input.mouse.grabbed = nk_true;
}
}
/* check if previously active property is now inactive */
if (*state == NK_PROPERTY_DEFAULT && old_state != NK_PROPERTY_DEFAULT) {
if (old_state == NK_PROPERTY_DRAG) {
ctx->input.mouse.grab = nk_false;
ctx->input.mouse.grabbed = nk_false;
ctx->input.mouse.ungrab = nk_true;
}
win->property.select_start = 0;
win->property.select_end = 0;
win->property.active = 0;
}
}